

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<long_long,_unsigned_long,_4>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (longlong *t,unsigned_long *u,longlong *result)

{
  uint64_t uVar1;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if ((long)*in_RDI < 0) {
    uVar1 = AbsValueHelper<long_long,_1>::Abs(0x1e690a);
    *in_RDX = (uVar1 % *in_RSI ^ 0xffffffffffffffff) + 1;
  }
  else {
    *in_RDX = *in_RDI % *in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //t could be negative - if so, need to convert to positive
        if(t < 0)
            result = (T)( ~( AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( t ) % u ) + 1);
        else
            result = (T)( (T)t % u );
    }